

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_string.c
# Opt level: O1

int parseConvertElement(mpt_convertable *conv,mpt_type_t type,void *dest)

{
  byte bVar1;
  ushort **ppuVar2;
  char *pcVar3;
  _mpt_vptr_convertable *p_Var4;
  mpt_convertable *sep;
  iovec *vec;
  char *txt;
  size_t klen;
  mpt_convertable local_20;
  size_t local_18;
  
  local_20._vptr = conv[4]._vptr;
  if (local_20._vptr == (_mpt_vptr_convertable *)0x0) {
    return 0;
  }
  if (conv[6]._vptr != (_mpt_vptr_convertable *)0x0) {
    *(undefined1 *)&(conv[6]._vptr)->convert = *(undefined1 *)&conv[7]._vptr;
  }
  if (*(char *)&(local_20._vptr)->convert == '\0') {
    if (type != 0x73) {
      if (conv[6]._vptr != (_mpt_vptr_convertable *)0x0) {
        conv[6]._vptr = (_mpt_vptr_convertable *)0x0;
        return -0x10;
      }
      return -0x10;
    }
    if (dest != (void *)0x0) {
      *(undefined8 *)dest = 0;
    }
  }
  else if (type == 0x73) {
    ppuVar2 = __ctype_b_loc();
    bVar1 = *(byte *)((long)*ppuVar2 + (long)*(char *)&(local_20._vptr)->convert * 2 + 1);
    while ((bVar1 & 0x20) != 0) {
      local_20._vptr = (_mpt_vptr_convertable *)((long)&(local_20._vptr)->convert + 1);
      bVar1 = *(byte *)((long)*ppuVar2 + (long)*(char *)&(local_20._vptr)->convert * 2 + 1);
    }
    if (dest != (void *)0x0) {
      *(_mpt_vptr_convertable **)dest = local_20._vptr;
    }
  }
  else {
    if (type == 0x6b) {
      sep = (mpt_convertable *)0x0;
      if (*(char *)&conv[8]._vptr != '\0') {
        sep = conv + 8;
      }
      pcVar3 = mpt_convert_key((char **)&local_20,(char *)sep,&local_18);
      if (pcVar3 == (char *)0x0) {
        local_20._vptr._0_4_ = 0;
        if (conv[6]._vptr != (_mpt_vptr_convertable *)0x0) {
          conv[6]._vptr = (_mpt_vptr_convertable *)0x0;
        }
      }
      else {
        if (dest != (void *)0x0) {
          *(char **)dest = pcVar3;
        }
        local_20._vptr._0_4_ = (int)local_20._vptr - *(int *)&conv[4]._vptr;
      }
      if (pcVar3 == (char *)0x0) {
        return -2;
      }
    }
    else {
      if (type == 0x43) {
        ppuVar2 = __ctype_b_loc();
        bVar1 = *(byte *)((long)*ppuVar2 + (long)*(char *)&(local_20._vptr)->convert * 2 + 1);
        while ((bVar1 & 0x20) != 0) {
          local_20._vptr = (_mpt_vptr_convertable *)((long)&(local_20._vptr)->convert + 1);
          bVar1 = *(byte *)((long)*ppuVar2 + (long)*(char *)&(local_20._vptr)->convert * 2 + 1);
        }
        bVar1 = *(byte *)((long)*ppuVar2 + (long)*(char *)&(local_20._vptr)->convert * 2 + 1);
        while ((bVar1 & 0x20) == 0) {
          local_20._vptr = (_mpt_vptr_convertable *)((long)&(local_20._vptr)->convert + 1);
          bVar1 = *(byte *)((long)*ppuVar2 + (long)*(char *)&(local_20._vptr)->convert * 2 + 1);
        }
        conv[6]._vptr = local_20._vptr;
        *(undefined1 *)&conv[7]._vptr = *(undefined1 *)&(local_20._vptr)->convert;
        *(undefined1 *)&(local_20._vptr)->convert = 0;
        if (dest != (void *)0x0) {
          p_Var4 = conv[4]._vptr;
          *(_mpt_vptr_convertable **)dest = p_Var4;
          *(long *)((long)dest + 8) = (long)local_20._vptr - (long)p_Var4;
          return 0x73;
        }
        return 0x73;
      }
      local_20._vptr._0_4_ = mpt_convert_string((char *)conv[4]._vptr,type,dest);
      if ((int)local_20._vptr < 0) {
        return (int)local_20._vptr;
      }
    }
    p_Var4 = (_mpt_vptr_convertable *)((long)&(conv[4]._vptr)->convert + (long)(int)local_20._vptr);
    conv[6]._vptr = p_Var4;
    if (p_Var4 < conv[5]._vptr) {
      *(undefined1 *)&conv[7]._vptr = *(undefined1 *)&p_Var4->convert;
      *(undefined1 *)&p_Var4->convert = 0;
      return 0x73;
    }
  }
  conv[6]._vptr = (_mpt_vptr_convertable *)0x0;
  return 0x73;
}

Assistant:

static int parseConvertElement(MPT_INTERFACE(convertable) *conv, MPT_TYPE(type) type, void *dest)
{
	MPT_STRUCT(parseIterator) *it = MPT_baseaddr(parseIterator, conv, elem._conv);
	const char *txt;
	int len;
	
	/* indicate consumed value */
	if (!(txt = it->val)) {
		return 0;
	}
	/* reset value end indicator */
	if (it->restore) {
		*it->restore = it->save;
	}
	if (!*txt) {
		if (type == 's') {
			if (dest) ((char **) dest)[0] = 0;
			it->restore = 0;
			return 's';
		}
		if (it->restore) {
			it->restore = 0;
		}
		return MPT_ERROR(MissingData);
	}
	/* return full remaining data */
	if (type == 's') {
		while (isspace(*txt)) ++txt;
		if (dest) *((const char **) dest) = txt;
		it->restore = 0;
		return 's';
	}
	if (type == MPT_type_toVector('c')) {
		while (isspace(*txt)) ++txt;
		while (!isspace(*txt)) ++txt;
		it->restore = (char *) txt;
		it->save = *txt;
		*it->restore = 0;
		if (dest) {
			struct iovec *vec = dest;
			vec->iov_base = it->val;
			vec->iov_len = txt - it->val;
		}
		return 's';
	}
	/* consume next complete word */
	if (type == 'k') {
		const char *sep = (char *) (it + 1);
		const char *key;
		size_t klen;
		if (!(key = mpt_convert_key(&txt, *sep ? sep : 0, &klen))) {
			if (it->restore) {
				it->restore = 0;
			}
			return MPT_ERROR(BadValue);
		}
		if (dest) {
			((const char **) dest)[0] = key;
		}
		len = txt - it->val;
	}
	/* convert to target type */
	else if ((len = mpt_convert_string(it->val, type, dest)) < 0) {
		return len;
	}
	/* terminate consumed substring */
	it->restore = it->val + len;
	if (it->restore >= it->end) {
		it->restore = 0;
	} else {
		it->save = *it->restore;
		*it->restore = 0;
	}
	return 's';
}